

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 *puVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  BIT_DStream_status BVar12;
  size_t sVar13;
  long lVar14;
  ushort *puVar15;
  ushort *puVar16;
  size_t sVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  ushort *puVar22;
  ushort *puVar23;
  char cVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  uint uVar28;
  uint uVar29;
  ulong *puVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  U64 bits [4];
  BYTE *pStart;
  BYTE *ip [4];
  HUF_DecompressFastArgs args;
  BIT_DStream_t local_258;
  ushort *local_230;
  ulong local_228;
  ushort *local_220;
  undefined1 local_218 [8];
  ulong uStack_210;
  ulong *local_208;
  ulong *puStack_200;
  ulong *local_1f8;
  ulong uStack_1f0;
  undefined1 local_1e8 [8];
  ulong uStack_1e0;
  ulong *local_1d8;
  ulong *puStack_1d0;
  ulong *local_1c8;
  ulong *local_1c0;
  ushort *local_1b8;
  size_t local_1b0;
  ushort *local_1a8;
  uint local_19c;
  ushort *local_198;
  undefined8 local_190;
  ushort *local_188;
  ushort *local_180;
  HUF_DecompressFastArgs local_178;
  int local_dc;
  ulong *local_d8;
  ulong local_d0;
  ulong *local_c8;
  ushort *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong *local_a8;
  ulong *local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong local_88;
  ulong local_80;
  undefined1 *local_78;
  ulong local_70;
  undefined1 *local_68;
  ulong *local_60;
  BYTE *local_58 [2];
  ushort *local_48;
  BYTE *local_40;
  
  local_1c0 = (ulong *)cSrc;
  local_1b0 = dstSize;
  if ((flags & 0x20U) == 0) {
    local_230 = (ushort *)dst;
    local_d8 = (ulong *)cSrcSize;
    sVar13 = HUF_DecompressFastArgs_init(&local_178,dst,dstSize,cSrc,cSrcSize,DTable);
    sVar17 = sVar13;
    if (sVar13 - 1 < 0xffffffffffffff88) {
      if (local_178.ip[0] < local_178.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x658,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      local_1b8 = (ushort *)((long)local_1c0 + 6);
      local_220 = (ushort *)((long)local_230 + dstSize);
      local_258.bitContainer = local_178.bits[0];
      local_258._8_8_ = local_178.bits[1];
      local_258.ptr = (char *)local_178.bits[2];
      local_258.start = (char *)local_178.bits[3];
      local_1e8 = (undefined1  [8])local_178.ip[0];
      uStack_1e0 = (ulong)local_178.ip[1];
      local_1d8 = (ulong *)local_178.ip[2];
      puStack_1d0 = (ulong *)local_178.ip[3];
      local_218 = (undefined1  [8])local_178.op[0];
      uStack_210 = (ulong)local_178.op[1];
      local_208 = (ulong *)local_178.op[2];
      puStack_200 = (ulong *)local_178.op[3];
      local_58[0] = local_178.op[1];
      local_58[1] = local_178.op[2];
      local_48 = (ushort *)local_178.op[3];
      local_40 = local_178.oend;
      lVar14 = 0;
      do {
        do {
          if (local_58[lVar14] < *(BYTE **)(local_218 + lVar14 * 8)) {
            __assert_fail("op[stream] <= oend[stream]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x5da,
                          "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          if (*(ushort **)(local_1e8 + lVar14 * 8) < local_178.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x5db,
                          "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        lVar14 = 0;
        uVar26 = (ulong)((long)local_1e8 - (long)local_178.ilimit) / 7;
        do {
          uVar20 = (ulong)((long)local_58[lVar14] - *(long *)(local_218 + lVar14 * 8)) / 10;
          if (uVar26 < uVar20) {
            uVar20 = uVar26;
          }
          lVar14 = lVar14 + 1;
          uVar26 = uVar20;
        } while (lVar14 != 4);
        if (uVar20 < 2) {
          iVar21 = 2;
          bVar37 = false;
        }
        else {
          lVar14 = 1;
          do {
            bVar37 = *(ulong *)(local_1e8 + lVar14 * 8) >= (&uStack_1f0)[lVar14];
            if (*(ulong *)(local_1e8 + lVar14 * 8) < (&uStack_1f0)[lVar14]) {
              iVar21 = 0xd;
              goto LAB_0021e663;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          iVar21 = 0;
          bVar37 = true;
        }
LAB_0021e663:
        if (bVar37) {
          puVar15 = (ushort *)(uVar20 * 5 + (long)puStack_200);
          lVar14 = 1;
          do {
            if (*(ulong *)(local_1e8 + lVar14 * 8) < (&uStack_1f0)[lVar14]) {
              __assert_fail("ip[stream] >= ip[stream - 1]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                            ,0x60a,
                            "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                           );
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          iVar21 = 0;
          do {
            do {
              lVar14 = 0;
              do {
                uVar26 = (&local_258.bitContainer)[lVar14];
                uVar20 = uVar26 >> 0x35;
                bVar18 = *(byte *)((long)local_178.dt + uVar20 * 4 + 2);
                bVar2 = *(byte *)((long)local_178.dt + uVar20 * 4 + 3);
                puVar6 = *(undefined2 **)(local_218 + lVar14 * 8);
                *puVar6 = *(undefined2 *)((long)local_178.dt + uVar20 * 4);
                (&local_258.bitContainer)[lVar14] = uVar26 << (bVar18 & 0x3f);
                *(ulong *)(local_218 + lVar14 * 8) = (ulong)bVar2 + (long)puVar6;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              iVar21 = iVar21 + 1;
            } while (iVar21 != 5);
            uVar26 = (ulong)local_258.start >> 0x35;
            bVar18 = *(byte *)((long)local_178.dt + uVar26 * 4 + 2);
            bVar2 = *(byte *)((long)local_178.dt + uVar26 * 4 + 3);
            *(ushort *)puStack_200 = *(ushort *)((long)local_178.dt + uVar26 * 4);
            local_258.start = (char *)((long)local_258.start << (bVar18 & 0x3f));
            puStack_200 = (ulong *)((ulong)bVar2 + (long)puStack_200);
            lVar14 = 0;
            do {
              uVar26 = (ulong)local_258.start >> 0x35;
              bVar18 = *(byte *)((long)local_178.dt + uVar26 * 4 + 2);
              bVar2 = *(byte *)((long)local_178.dt + uVar26 * 4 + 3);
              *(ushort *)puStack_200 = *(ushort *)((long)local_178.dt + uVar26 * 4);
              local_258.start = (char *)((long)local_258.start << (bVar18 & 0x3f));
              puStack_200 = (ulong *)((ulong)bVar2 + (long)puStack_200);
              uVar26 = (&local_258.bitContainer)[lVar14];
              if (uVar26 == 0) {
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                              ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
              }
              uVar20 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              puVar30 = (ulong *)(*(long *)(local_1e8 + lVar14 * 8) - (uVar20 >> 3 & 0x1fffffff));
              *(ulong **)(local_1e8 + lVar14 * 8) = puVar30;
              (&local_258.bitContainer)[lVar14] = (*puVar30 | 1) << ((byte)uVar20 & 7);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            iVar21 = 0;
          } while (puStack_200 < puVar15);
        }
        lVar14 = 0;
      } while (iVar21 == 0);
      local_178.bits[2] = (U64)local_258.ptr;
      local_178.bits[3] = (U64)local_258.start;
      local_178.bits[0] = local_258.bitContainer;
      local_178.bits[1] = local_258._8_8_;
      local_178.ip[0] = (BYTE *)local_1e8;
      local_178.ip[1] = (BYTE *)uStack_1e0;
      local_178.ip[2] = (BYTE *)local_1d8;
      local_178.ip[3] = (BYTE *)puStack_1d0;
      local_178.op[2] = (BYTE *)local_208;
      local_178.op[3] = (BYTE *)puStack_200;
      local_178.op[0] = (BYTE *)local_218;
      local_178.op[1] = (BYTE *)uStack_210;
      if ((ulong)local_1e8 < local_1b8) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65c,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (uStack_1e0 < local_1b8) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65d,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_1d8 < local_1b8) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65e,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1d0 < local_1b8) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x65f,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_220 < puStack_200) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x660,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      local_1b8 = (ushort *)(dstSize + 3 >> 2);
      lVar14 = 0;
      puVar15 = local_230;
LAB_0021e858:
      puVar16 = (ushort *)((long)local_220 - (long)puVar15);
      puVar15 = (ushort *)((long)puVar15 + (long)local_1b8);
      if (puVar16 < local_1b8) {
        puVar15 = local_220;
      }
      sVar17 = HUF_initRemainingDStream(&local_258,&local_178,(int)lVar14,(BYTE *)puVar15);
      if (sVar17 < 0xffffffffffffff89) {
        puVar16 = (ushort *)local_178.op[lVar14];
        iVar21 = (int)local_258.start;
        puVar22 = puVar16;
        if (7 < (ulong)((long)puVar15 - (long)puVar16)) {
          do {
            if (local_258.bitsConsumed < 0x41) {
              if (local_258.ptr < local_258.limitPtr) {
                if (local_258.ptr == local_258.start) goto LAB_0021e8e1;
                bVar37 = local_258.start <=
                         (U64 *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
                uVar19 = (int)local_258.ptr - iVar21;
                if (bVar37) {
                  uVar19 = local_258.bitsConsumed >> 3;
                }
                local_258.bitsConsumed = local_258.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = local_258.bitsConsumed >> 3;
                local_258.bitsConsumed = local_258.bitsConsumed & 7;
                bVar37 = true;
              }
              local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar19);
              local_258.bitContainer = *(size_t *)local_258.ptr;
            }
            else {
LAB_0021e8e1:
              bVar37 = false;
            }
            if (((ushort *)((long)puVar15 - 9U) <= puVar22) || (!bVar37)) goto LAB_0021ea65;
            uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> 0x35;
            *puVar22 = (ushort)DTable[uVar26 + 1];
            iVar11 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_258.bitsConsumed;
            uVar34 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
            uVar26 = (local_258.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)((long)puVar22 + uVar34) = (short)DTable[uVar26 + 1];
            iVar11 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar11;
            uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
            lVar9 = uVar26 + uVar34;
            uVar20 = (local_258.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)((long)puVar22 + uVar26 + uVar34) = (short)DTable[uVar20 + 1];
            iVar11 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar11;
            uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
            lVar10 = uVar26 + lVar9;
            uVar20 = (local_258.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)((long)puVar22 + uVar26 + lVar9) = (short)DTable[uVar20 + 1];
            iVar11 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar11;
            uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
            uVar20 = (local_258.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            *(short *)((long)puVar22 + uVar26 + lVar10) = (short)DTable[uVar20 + 1];
            local_258.bitsConsumed = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar11;
            puVar22 = (ushort *)
                      ((long)puVar22 +
                      (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7) + uVar26 + lVar10);
          } while( true );
        }
        if (local_258.bitsConsumed < 0x41) {
          if (local_258.ptr < local_258.limitPtr) {
            if (local_258.ptr == local_258.start) goto LAB_0021eaa4;
            uVar19 = (int)local_258.ptr - iVar21;
            if (local_258.start <=
                (U64 *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3))) {
              uVar19 = local_258.bitsConsumed >> 3;
            }
            local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar19);
            local_258.bitsConsumed = local_258.bitsConsumed + uVar19 * -8;
          }
          else {
            local_258.ptr = (char *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
            local_258.bitsConsumed = local_258.bitsConsumed & 7;
          }
          local_258.bitContainer = *(U64 *)local_258.ptr;
        }
        goto LAB_0021eaa4;
      }
      bVar37 = false;
      sVar13 = sVar17;
      goto LAB_0021ec27;
    }
LAB_0021ec3e:
    dst = local_230;
    cSrcSize = (size_t)local_d8;
    if (sVar17 != 0) {
      return sVar17;
    }
  }
  if (cSrcSize < (ulong *)0xa) {
    return 0xffffffffffffffec;
  }
  uVar3 = (ushort)*local_1c0;
  uVar34 = (ulong)uVar3;
  uVar4 = *(ushort *)((long)local_1c0 + 2);
  uVar20 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)local_1c0 + 4);
  uVar26 = (ulong)uVar5;
  puVar30 = (ulong *)(uVar34 + uVar20 + uVar26 + 6);
  uVar35 = cSrcSize - (long)puVar30;
  if ((dstSize < 6) || (cSrcSize < puVar30)) {
    return 0xffffffffffffffec;
  }
  local_180 = (ushort *)((long)dst + dstSize);
  uVar36 = dstSize + 3 >> 2;
  puVar15 = (ushort *)((long)dst + uVar36);
  local_198 = (ushort *)((long)puVar15 + uVar36);
  puVar16 = (ushort *)(uVar36 + (long)local_198);
  if (local_180 < puVar16) {
    return 0xffffffffffffffec;
  }
  local_258.start = (char *)((long)local_1c0 + uVar34 + 6);
  if (uVar34 == 0) {
    local_178.ip[2] = (BYTE *)0x0;
    local_178.ip[3] = (BYTE *)0x0;
    local_178.ip[0] = (BYTE *)0x0;
    local_178.ip[1] = (BYTE *)0x0;
    local_178.op[0] = (BYTE *)0x0;
    uVar36 = 0xffffffffffffffb8;
  }
  else {
    local_178.ip[3] = (BYTE *)((long)local_1c0 + 6);
    local_178.op[0] = (BYTE *)((long)local_1c0 + 0xe);
    uVar36 = uVar34;
    if (uVar3 < 8) {
      local_178.ip[0] = (BYTE *)(ulong)(byte)*(ulong *)local_178.ip[3];
      switch(uVar3) {
      case 7:
        local_178.ip[0] =
             (BYTE *)((ulong)(byte)*(ushort *)((long)local_1c0 + 0xc) << 0x30 |
                     (ulong)local_178.ip[0]);
      case 6:
        local_178.ip[0] = local_178.ip[0] + ((ulong)*(byte *)((long)local_1c0 + 0xb) << 0x28);
      case 5:
        local_178.ip[0] = local_178.ip[0] + ((ulong)(byte)*(ushort *)((long)local_1c0 + 10) << 0x20)
        ;
      case 4:
        local_178.ip[0] = local_178.ip[0] + (ulong)*(byte *)((long)local_1c0 + 9) * 0x1000000;
      case 3:
        local_178.ip[0] = local_178.ip[0] + (ulong)(byte)*(ushort *)((long)local_1c0 + 8) * 0x10000;
      case 2:
        local_178.ip[0] = local_178.ip[0] + (ulong)*(byte *)((long)local_1c0 + 7) * 0x100;
      default:
        bVar18 = *(byte *)((long)local_1c0 + uVar34 + 5);
        uVar19 = 0x1f;
        if (bVar18 != 0) {
          for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        iVar21 = ~uVar19 + 9;
        if (bVar18 == 0) {
          iVar21 = 0;
        }
        local_178.ip[1] = (BYTE *)CONCAT44(local_178.ip[1]._4_4_,iVar21);
        local_178.ip[2] = local_178.ip[3];
        if (bVar18 == 0) {
          uVar36 = 0xffffffffffffffec;
        }
        else {
          local_178.ip[1] =
               (BYTE *)CONCAT44(local_178.ip[1]._4_4_,iVar21 + ((uint)uVar3 * -8 + 0x40 & 0xffff));
        }
      }
    }
    else {
      local_178.ip[2] = (BYTE *)((long)local_1c0 + (uVar34 - 2));
      local_178.ip[0] = *(BYTE **)((long)local_1c0 + (uVar34 - 2));
      bVar18 = *(byte *)((long)local_1c0 + uVar34 + 5);
      uVar19 = 0x1f;
      if (bVar18 != 0) {
        for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      iVar21 = ~uVar19 + 9;
      if (bVar18 == 0) {
        iVar21 = 0;
      }
      local_178.ip[1] = (BYTE *)CONCAT44(local_178.ip[1]._4_4_,iVar21);
      if (bVar18 == 0) {
        uVar36 = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < uVar36) {
    return uVar36;
  }
  puStack_1d0 = (ulong *)((long)local_258.start + uVar20);
  if (uVar20 == 0) {
    local_258.ptr = (char *)0x0;
    local_258.start = (char *)0x0;
    local_258.bitContainer = 0;
    local_258._8_8_ = 0;
    local_258.limitPtr = (char *)0x0;
    uVar20 = 0xffffffffffffffb8;
  }
  else {
    local_258.limitPtr = (char *)((long)local_1c0 + uVar34 + 0xe);
    if (uVar4 < 8) {
      local_258.bitContainer = (size_t)(byte)*(ulong *)local_258.start;
      switch(uVar4) {
      case 7:
        local_258.bitContainer =
             (ulong)*(byte *)((long)local_1c0 + uVar34 + 0xc) << 0x30 | local_258.bitContainer;
      case 6:
        local_258.bitContainer =
             local_258.bitContainer + ((ulong)*(byte *)((long)local_1c0 + uVar34 + 0xb) << 0x28);
      case 5:
        local_258.bitContainer =
             local_258.bitContainer + ((ulong)*(byte *)((long)local_1c0 + uVar34 + 10) << 0x20);
      case 4:
        local_258.bitContainer =
             local_258.bitContainer + (ulong)*(byte *)((long)local_1c0 + uVar34 + 9) * 0x1000000;
      case 3:
        local_258.bitContainer =
             local_258.bitContainer + (ulong)*(byte *)((long)local_1c0 + uVar34 + 8) * 0x10000;
      case 2:
        local_258.bitContainer =
             local_258.bitContainer + (ulong)*(byte *)((long)local_1c0 + uVar34 + 7) * 0x100;
      default:
        bVar18 = *(byte *)((long)puStack_1d0 + -1);
        uVar19 = 0x1f;
        if (bVar18 != 0) {
          for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        if (bVar18 == 0) {
          uVar20 = 0xffffffffffffffec;
          local_258.bitsConsumed = 0;
        }
        else {
          local_258.bitsConsumed = ~uVar19 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
        }
        local_258.ptr = local_258.start;
      }
    }
    else {
      local_258.bitContainer = puStack_1d0[-1];
      bVar18 = *(byte *)((long)puStack_1d0 + -1);
      uVar19 = 0x1f;
      if (bVar18 != 0) {
        for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      local_258.bitsConsumed = ~uVar19 + 9;
      if (bVar18 == 0) {
        local_258.bitsConsumed = 0;
      }
      local_258.ptr = (char *)(puStack_1d0 + -1);
      if (bVar18 == 0) {
        uVar20 = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < uVar20) {
    return uVar20;
  }
  puStack_200 = (ulong *)((long)puStack_1d0 + uVar26);
  if (uVar26 == 0) {
    local_1d8 = (ulong *)0x0;
    puStack_1d0 = (ulong *)0x0;
    local_1e8 = (undefined1  [8])0x0;
    uStack_1e0 = 0;
    local_1c8 = (ulong *)0x0;
    uVar26 = 0xffffffffffffffb8;
  }
  else {
    local_1c8 = puStack_1d0 + 1;
    if (uVar5 < 8) {
      local_1e8 = (undefined1  [8])(ulong)(byte)*puStack_1d0;
      switch(uVar5) {
      case 7:
        local_1e8 = (undefined1  [8])
                    ((ulong)*(byte *)((long)puStack_1d0 + 6) << 0x30 | (ulong)local_1e8);
      case 6:
        local_1e8 = (undefined1  [8])
                    ((long)local_1e8 + ((ulong)*(byte *)((long)puStack_1d0 + 5) << 0x28));
      case 5:
        local_1e8 = (undefined1  [8])
                    ((long)local_1e8 + ((ulong)*(byte *)((long)puStack_1d0 + 4) << 0x20));
      case 4:
        local_1e8 = (undefined1  [8])
                    ((long)local_1e8 + (ulong)*(byte *)((long)puStack_1d0 + 3) * 0x1000000);
      case 3:
        local_1e8 = (undefined1  [8])
                    ((long)local_1e8 + (ulong)*(byte *)((long)puStack_1d0 + 2) * 0x10000);
      case 2:
        local_1e8 = (undefined1  [8])
                    ((long)local_1e8 + (ulong)*(byte *)((long)puStack_1d0 + 1) * 0x100);
      default:
        bVar18 = *(byte *)((long)puStack_200 + -1);
        uVar19 = 0x1f;
        if (bVar18 != 0) {
          for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        iVar21 = ~uVar19 + 9;
        if (bVar18 == 0) {
          iVar21 = 0;
        }
        uStack_1e0 = CONCAT44(uStack_1e0._4_4_,iVar21);
        local_1d8 = puStack_1d0;
        if (bVar18 == 0) {
          uVar26 = 0xffffffffffffffec;
        }
        else {
          uStack_1e0 = CONCAT44(uStack_1e0._4_4_,iVar21 + ((uint)uVar5 * -8 + 0x40 & 0xffff));
        }
      }
    }
    else {
      local_1e8 = (undefined1  [8])puStack_200[-1];
      bVar18 = *(byte *)((long)puStack_200 + -1);
      uVar19 = 0x1f;
      if (bVar18 != 0) {
        for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      iVar21 = ~uVar19 + 9;
      if (bVar18 == 0) {
        iVar21 = 0;
      }
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,iVar21);
      local_1d8 = puStack_200 + -1;
      if (bVar18 == 0) {
        uVar26 = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < uVar26) {
    return uVar26;
  }
  if (uVar35 == 0) {
    local_208 = (ulong *)0x0;
    puStack_200 = (ulong *)0x0;
    local_218 = (undefined1  [8])0x0;
    uStack_210 = 0;
    local_1f8 = (ulong *)0x0;
    uVar35 = 0xffffffffffffffb8;
  }
  else {
    local_1f8 = puStack_200 + 1;
    if (uVar35 < 8) {
      local_218 = (undefined1  [8])(ulong)(byte)*puStack_200;
      switch(uVar35) {
      case 7:
        local_218 = (undefined1  [8])
                    ((ulong)*(byte *)((long)puStack_200 + 6) << 0x30 | (ulong)local_218);
      case 6:
        local_218 = (undefined1  [8])
                    ((long)local_218 + ((ulong)*(byte *)((long)puStack_200 + 5) << 0x28));
      case 5:
        local_218 = (undefined1  [8])
                    ((long)local_218 + ((ulong)*(byte *)((long)puStack_200 + 4) << 0x20));
      case 4:
        local_218 = (undefined1  [8])
                    ((long)local_218 + (ulong)*(byte *)((long)puStack_200 + 3) * 0x1000000);
      case 3:
        local_218 = (undefined1  [8])
                    ((long)local_218 + (ulong)*(byte *)((long)puStack_200 + 2) * 0x10000);
      case 2:
        local_218 = (undefined1  [8])
                    ((long)local_218 + (ulong)*(byte *)((long)puStack_200 + 1) * 0x100);
      default:
        bVar18 = *(byte *)((long)puStack_200 + (uVar35 - 1));
        uVar19 = 0x1f;
        if (bVar18 != 0) {
          for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        iVar21 = ~uVar19 + 9;
        if (bVar18 == 0) {
          iVar21 = 0;
        }
        uStack_210 = CONCAT44(uStack_210._4_4_,iVar21);
        local_208 = puStack_200;
        if (bVar18 == 0) {
          uVar35 = 0xffffffffffffffec;
        }
        else {
          uStack_210 = CONCAT44(uStack_210._4_4_,iVar21 + (int)uVar35 * -8 + 0x40);
        }
      }
    }
    else {
      local_208 = (ulong *)((long)puStack_200 + (uVar35 - 8));
      local_218 = (undefined1  [8])*local_208;
      bVar18 = *(byte *)((long)puStack_200 + (uVar35 - 1));
      uVar19 = 0x1f;
      if (bVar18 != 0) {
        for (; bVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      iVar21 = ~uVar19 + 9;
      if (bVar18 == 0) {
        iVar21 = 0;
      }
      uStack_210 = CONCAT44(uStack_210._4_4_,iVar21);
      if (bVar18 == 0) {
        uVar35 = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < uVar35) {
    return uVar35;
  }
  uVar19 = *DTable >> 0x10;
  local_228 = (ulong)uVar19;
  local_c0 = (ushort *)((long)dst + (dstSize - 7));
  cVar24 = (char)(*DTable >> 0x10);
  puVar22 = puVar15;
  puVar30 = (ulong *)local_198;
  local_230 = (ushort *)dst;
  puVar23 = puVar16;
  local_1a8 = puVar16;
  if (puVar16 < local_c0 && 7 < (ulong)((long)local_180 - (long)puVar16)) {
    if ((uVar19 & 0xff) == 0) goto LAB_00221126;
    bVar18 = -cVar24 & 0x3f;
    local_90 = (ulong *)local_178.op[0];
    local_98 = (ulong *)local_258.limitPtr;
    local_a0 = local_1c8;
    local_a8 = local_1f8;
    local_1c0 = local_208;
    local_c8 = (ulong *)local_258.ptr;
    local_d8 = (ulong *)local_178.ip[2];
    local_190 = CONCAT44(local_190._4_4_,local_258.bitsConsumed);
    local_b0 = local_258.bitContainer;
    local_d0 = (ulong)local_1e8;
    local_b8 = (ulong)local_218;
    puVar27 = local_1d8;
    local_220 = (ushort *)local_178.ip[0];
    uVar31 = (uint)uStack_1e0;
    uVar33 = (uint)local_178.ip[1];
    uVar29 = (uint)uStack_210;
    local_1b8 = puVar15;
    do {
      local_60 = puVar27;
      uVar26 = (ulong)((long)local_220 << ((byte)uVar33 & 0x3f)) >> bVar18;
      *local_230 = (ushort)DTable[uVar26 + 1];
      iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + uVar33;
      uVar20 = (ulong)((long)local_220 << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      *(short *)((long)local_230 + uVar26) = (short)DTable[uVar20 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
      uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
      uVar34 = (ulong)((long)local_220 << ((byte)iVar21 & 0x3f)) >> bVar18;
      local_68 = (undefined1 *)((long)local_230 + uVar20 + uVar26);
      *(short *)((long)local_230 + uVar20 + uVar26) = (short)DTable[uVar34 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
      local_70 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      uVar26 = (ulong)((long)local_220 << ((byte)iVar21 & 0x3f)) >> bVar18;
      *(short *)(local_68 + local_70) = (short)DTable[uVar26 + 1];
      uVar25 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
      uVar20 = (local_b0 << ((byte)local_190 & 0x3f)) >> bVar18;
      local_230 = (ushort *)(ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      *local_1b8 = (ushort)DTable[uVar20 + 1];
      iVar21 = *(byte *)((long)DTable + uVar20 * 4 + 6) + (uint)local_190;
      uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
      uVar26 = (local_b0 << ((byte)iVar21 & 0x3f)) >> bVar18;
      *(short *)((long)local_1b8 + uVar20) = (short)DTable[uVar26 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
      uVar34 = (local_b0 << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      *(short *)((long)local_1b8 + uVar26 + uVar20) = (short)DTable[uVar34 + 1];
      local_78 = (undefined1 *)((long)local_1b8 + uVar26 + uVar20);
      iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
      uVar26 = (local_b0 << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar20 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      *(short *)(local_78 + uVar20) = (short)DTable[uVar26 + 1];
      uVar33 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
      puVar22 = (ushort *)(ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      iVar21 = 3;
      if (local_d8 < local_178.op[0]) {
        local_dc = 3;
        local_19c = uVar25;
      }
      else {
        if (0x40 < uVar25) goto LAB_00221239;
        local_d8 = (ulong *)((long)local_d8 - (ulong)(uVar25 >> 3));
        local_220 = (ushort *)*local_d8;
        local_dc = 0;
        local_19c = uVar25 & 7;
        local_178.ip[0] = (BYTE *)local_220;
        local_178.ip[2] = (BYTE *)local_d8;
      }
      local_1b8 = puVar22;
      local_80 = uVar20;
      uVar25 = local_19c;
      if (local_c8 < local_258.limitPtr) {
        local_190 = CONCAT44(local_190._4_4_,uVar33);
      }
      else {
        if (0x40 < uVar33) goto LAB_00221239;
        local_c8 = (ulong *)((long)local_c8 - (ulong)(uVar33 >> 3));
        local_190 = CONCAT44(local_190._4_4_,uVar33) & 0xffffffff00000007;
        local_258.bitContainer = *local_c8;
        iVar21 = 0;
        local_258.ptr = (char *)local_c8;
        local_b0 = local_258.bitContainer;
      }
      uVar26 = (local_d0 << ((byte)uVar31 & 0x3f)) >> bVar18;
      *(ushort *)puVar30 = (ushort)DTable[uVar26 + 1];
      iVar11 = *(byte *)((long)DTable + uVar26 * 4 + 6) + uVar31;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar34 = (local_d0 << ((byte)iVar11 & 0x3f)) >> bVar18;
      *(short *)((long)puVar30 + uVar26) = (short)DTable[uVar34 + 1];
      iVar11 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar11;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      lVar14 = uVar34 + uVar26;
      uVar35 = (local_d0 << ((byte)iVar11 & 0x3f)) >> bVar18;
      *(short *)((long)puVar30 + uVar34 + uVar26) = (short)DTable[uVar35 + 1];
      iVar11 = (uint)*(byte *)((long)DTable + uVar35 * 4 + 6) + iVar11;
      uVar26 = (local_d0 << ((byte)iVar11 & 0x3f)) >> bVar18;
      uVar7 = (undefined4)(uStack_1e0 >> 0x20);
      local_88 = (ulong)*(byte *)((long)DTable + uVar35 * 4 + 7);
      *(short *)((long)puVar30 + local_88 + lVar14) = (short)DTable[uVar26 + 1];
      uVar31 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar11;
      uStack_1e0 = CONCAT44(uVar7,uVar31);
      uVar34 = (local_b8 << ((byte)uVar29 & 0x3f)) >> bVar18;
      bVar2 = *(byte *)((long)DTable + uVar26 * 4 + 7);
      *puVar23 = (ushort)DTable[uVar34 + 1];
      iVar11 = *(byte *)((long)DTable + uVar34 * 4 + 6) + uVar29;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      uVar26 = (local_b8 << ((byte)iVar11 & 0x3f)) >> bVar18;
      *(short *)((long)puVar23 + uVar34) = (short)DTable[uVar26 + 1];
      iVar11 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar11;
      uVar35 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar26 = (local_b8 << ((byte)iVar11 & 0x3f)) >> bVar18;
      *(short *)((long)puVar23 + uVar35 + uVar34) = (short)DTable[uVar26 + 1];
      lVar9 = uVar35 + uVar34;
      iVar11 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar11;
      uVar8 = (undefined4)(uStack_210 >> 0x20);
      uVar34 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar26 = (local_b8 << ((byte)iVar11 & 0x3f)) >> bVar18;
      *(short *)((long)puVar23 + uVar34 + lVar9) = (short)DTable[uVar26 + 1];
      uVar28 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar11;
      uStack_210 = CONCAT44(uVar8,uVar28);
      iVar11 = 3;
      uVar33 = (uint)local_190;
      if (local_60 < local_1c8) {
        iVar32 = 3;
        puVar27 = local_60;
      }
      else {
        if (0x40 < uVar31) goto LAB_00221239;
        local_1d8 = (ulong *)((long)local_60 - (ulong)(uVar31 >> 3));
        uStack_1e0 = CONCAT44(uVar7,uVar31) & 0xffffffff00000007;
        local_1e8 = (undefined1  [8])*local_1d8;
        iVar32 = 0;
        puVar27 = local_1d8;
        uVar31 = uVar31 & 7;
        local_d0 = (ulong)local_1e8;
      }
      uVar29 = uVar28;
      if (local_1f8 <= local_1c0) {
        if (0x40 < uVar28) {
LAB_00221239:
          local_178.ip[1] = (BYTE *)CONCAT44(local_178.ip[1]._4_4_,uVar25);
          local_258.bitsConsumed = uVar33;
          local_188 = puVar15;
          __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                        ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
        }
        local_208 = (ulong *)((long)local_1c0 - (ulong)(uVar28 >> 3));
        uVar29 = uVar28 & 7;
        uStack_210 = CONCAT44(uVar8,uVar28) & 0xffffffff00000007;
        local_218 = (undefined1  [8])*local_208;
        iVar11 = 0;
        local_1c0 = local_208;
        local_b8 = (ulong)local_218;
      }
      local_230 = (ushort *)(local_68 + (long)local_230 + local_70);
      local_1b8 = (ushort *)((long)puVar22 + (long)(local_78 + uVar20));
      puVar30 = (ulong *)((long)puVar30 + (ulong)bVar2 + local_88 + lVar14);
      puVar23 = (ushort *)
                ((long)puVar23 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7) + uVar34 + lVar9);
    } while ((puVar23 < local_c0) &&
            (uVar33 = local_19c, ((iVar21 == 0 && local_dc == 0) && iVar32 == 0) && iVar11 == 0));
    local_178.ip[1] = (BYTE *)CONCAT44(local_178.ip[1]._4_4_,local_19c);
    local_258.bitsConsumed = (uint)local_190;
    puVar22 = local_1b8;
    dstSize = local_1b0;
    local_188 = puVar15;
  }
  local_220 = puVar23;
  if (puVar15 < local_230) {
    return 0xffffffffffffffec;
  }
  if (local_198 < puVar22) {
    return 0xffffffffffffffec;
  }
  if (puVar16 < puVar30) {
    return 0xffffffffffffffec;
  }
  local_1c0 = puVar30;
  local_1b8 = puVar22;
  if ((ulong)((long)puVar15 - (long)local_230) < 8) {
    uVar29 = uVar19;
    if ((uint)local_178.ip[1] < 0x41) {
      if (local_178.ip[2] < local_178.op[0]) {
        if (local_178.ip[2] != local_178.ip[3]) {
          uVar31 = (int)local_178.ip[2] - (int)local_178.ip[3];
          if (local_178.ip[3] <=
              (ulong *)((long)local_178.ip[2] - (ulong)((uint)local_178.ip[1] >> 3))) {
            uVar31 = (uint)local_178.ip[1] >> 3;
          }
          local_178.ip[2] = (BYTE *)((long)local_178.ip[2] - (ulong)uVar31);
          local_178.ip[1] =
               (BYTE *)CONCAT44(local_178.ip[1]._4_4_,(uint)local_178.ip[1] + uVar31 * -8);
          local_178.ip[0] = *(BYTE **)local_178.ip[2];
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)&local_178);
        puVar22 = local_1b8;
        puVar30 = local_1c0;
      }
    }
  }
  else {
    if ((uVar19 & 0xff) < 0xc) {
      bVar18 = -cVar24 & 0x3f;
      local_188 = puVar15;
      while( true ) {
        BVar12 = BIT_DStream_overflow;
        if ((uint)local_178.ip[1] < 0x41) {
          if (local_178.ip[2] < local_178.op[0]) {
            if (local_178.ip[2] != local_178.ip[3]) {
              bVar37 = (ulong *)((long)local_178.ip[2] - (ulong)((uint)local_178.ip[1] >> 3)) <
                       local_178.ip[3];
              uVar29 = (int)local_178.ip[2] - (int)local_178.ip[3];
              if (!bVar37) {
                uVar29 = (uint)local_178.ip[1] >> 3;
              }
              BVar12 = (BIT_DStream_status)bVar37;
              local_178.ip[2] = (BYTE *)((long)local_178.ip[2] - (ulong)uVar29);
              local_178.ip[1] =
                   (BYTE *)CONCAT44(local_178.ip[1]._4_4_,(uint)local_178.ip[1] + uVar29 * -8);
              local_178.ip[0] = *(BYTE **)local_178.ip[2];
              puVar22 = local_1b8;
            }
          }
          else {
            BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&local_178);
            puVar22 = local_1b8;
            puVar30 = local_1c0;
          }
        }
        if (((ushort *)((long)puVar15 - 9U) <= local_230) || (BVar12 != BIT_DStream_unfinished))
        goto LAB_0021fda6;
        if ((uVar19 & 0xff) == 0) break;
        uVar26 = (ulong)((long)local_178.ip[0] << ((byte)local_178.ip[1] & 0x3f)) >> bVar18;
        *local_230 = (ushort)DTable[uVar26 + 1];
        iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + (uint)local_178.ip[1];
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        uVar20 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
        *(short *)((long)local_230 + uVar26) = (short)DTable[uVar20 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
        uVar34 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + uVar26;
        *(short *)((long)local_230 + uVar20 + uVar26) = (short)DTable[uVar34 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
        uVar26 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
        *(short *)((long)local_230 + uVar20 + lVar14) = (short)DTable[uVar26 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
        uVar34 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + lVar14;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        *(short *)((long)local_230 + uVar26 + lVar14) = (short)DTable[uVar34 + 1];
        local_178.ip[1] =
             (BYTE *)CONCAT44(local_178.ip[1]._4_4_,
                              iVar21 + (uint)*(byte *)((long)DTable + uVar34 * 4 + 6));
        local_230 = (ushort *)
                    ((long)local_230 +
                    (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7) + uVar26 + lVar14);
      }
      goto LAB_00221126;
    }
    bVar18 = -cVar24 & 0x3f;
    local_188 = puVar15;
    while( true ) {
      BVar12 = BIT_DStream_overflow;
      if ((uint)local_178.ip[1] < 0x41) {
        if (local_178.ip[2] < local_178.op[0]) {
          if (local_178.ip[2] != local_178.ip[3]) {
            bVar37 = (ulong *)((long)local_178.ip[2] - (ulong)((uint)local_178.ip[1] >> 3)) <
                     local_178.ip[3];
            uVar29 = (int)local_178.ip[2] - (int)local_178.ip[3];
            if (!bVar37) {
              uVar29 = (uint)local_178.ip[1] >> 3;
            }
            BVar12 = (BIT_DStream_status)bVar37;
            local_178.ip[2] = (BYTE *)((long)local_178.ip[2] - (ulong)uVar29);
            local_178.ip[1] =
                 (BYTE *)CONCAT44(local_178.ip[1]._4_4_,(uint)local_178.ip[1] + uVar29 * -8);
            local_178.ip[0] = *(BYTE **)local_178.ip[2];
            puVar22 = local_1b8;
          }
        }
        else {
          BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&local_178);
          puVar22 = local_1b8;
          puVar30 = local_1c0;
        }
      }
      if (((ushort *)((long)puVar15 - 7U) <= local_230) || (BVar12 != BIT_DStream_unfinished))
      break;
      uVar26 = (ulong)((long)local_178.ip[0] << ((byte)local_178.ip[1] & 0x3f)) >> bVar18;
      *local_230 = (ushort)DTable[uVar26 + 1];
      iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + (uint)local_178.ip[1];
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar34 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
      *(short *)((long)local_230 + uVar26) = (short)DTable[uVar34 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
      uVar20 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      *(short *)((long)local_230 + uVar34 + uVar26) = (short)DTable[uVar20 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
      uVar35 = (ulong)((long)local_178.ip[0] << ((byte)iVar21 & 0x3f)) >> bVar18;
      lVar14 = uVar34 + uVar26;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
      *(short *)((long)local_230 + uVar26 + lVar14) = (short)DTable[uVar35 + 1];
      local_178.ip[1] =
           (BYTE *)CONCAT44(local_178.ip[1]._4_4_,
                            iVar21 + (uint)*(byte *)((long)DTable + uVar35 * 4 + 6));
      local_230 = (ushort *)
                  ((long)local_230 +
                  (ulong)*(byte *)((long)DTable + uVar35 * 4 + 7) + uVar26 + lVar14);
    }
LAB_0021fda6:
    puVar15 = local_188;
    dstSize = local_1b0;
    puVar16 = local_1a8;
    uVar29 = (uint)local_228;
  }
  cVar24 = (char)uVar29;
  uVar29 = uVar19 & 0xff;
  puVar23 = local_230;
  if (1 < (ulong)((long)puVar15 - (long)local_230)) {
    puVar1 = puVar15 + -1;
    do {
      if ((uint)local_178.ip[1] < 0x41) {
        if (local_178.ip[2] < local_178.op[0]) {
          if (local_178.ip[2] == local_178.ip[3]) goto LAB_0021fe11;
          bVar37 = local_178.ip[3] <=
                   (ulong *)((long)local_178.ip[2] - (ulong)((uint)local_178.ip[1] >> 3));
          uVar31 = (int)local_178.ip[2] - (int)local_178.ip[3];
          if (bVar37) {
            uVar31 = (uint)local_178.ip[1] >> 3;
          }
          local_178.ip[2] = (BYTE *)((long)local_178.ip[2] - (ulong)uVar31);
          local_178.ip[1] =
               (BYTE *)CONCAT44(local_178.ip[1]._4_4_,(uint)local_178.ip[1] + uVar31 * -8);
          local_178.ip[0] = *(BYTE **)local_178.ip[2];
          puVar22 = local_1b8;
          puVar30 = local_1c0;
        }
        else {
          local_178.ip[2] = (BYTE *)((long)local_178.ip[2] - (ulong)((uint)local_178.ip[1] >> 3));
          local_178.ip[1] = (BYTE *)((ulong)local_178.ip[1] & 0xffffffff00000007);
          local_178.ip[0] = *(BYTE **)local_178.ip[2];
          bVar37 = true;
        }
      }
      else {
LAB_0021fe11:
        bVar37 = false;
      }
      if ((puVar1 < local_230) || (!bVar37)) {
        puVar23 = local_230;
        if (puVar1 < local_230) break;
        if (uVar29 != 0) goto LAB_0021ff28;
        goto LAB_00221126;
      }
      if (uVar29 == 0) goto LAB_00221126;
      uVar26 = (ulong)((long)local_178.ip[0] << ((byte)local_178.ip[1] & 0x3f)) >> (-cVar24 & 0x3fU)
      ;
      *local_230 = (ushort)DTable[uVar26 + 1];
      local_178.ip[1] =
           (BYTE *)CONCAT44(local_178.ip[1]._4_4_,
                            (uint)local_178.ip[1] + *(byte *)((long)DTable + uVar26 * 4 + 6));
      local_230 = (ushort *)((long)local_230 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
    } while( true );
  }
LAB_0021ff62:
  if (puVar23 < puVar15) {
    sVar13 = BIT_lookBitsFast((BIT_DStream_t *)&local_178,uVar29);
    *(char *)puVar23 = (char)DTable[sVar13 + 1];
    puVar22 = local_1b8;
    puVar30 = local_1c0;
    if (*(char *)((long)DTable + sVar13 * 4 + 7) == '\x01') {
      local_178.ip[1] =
           (BYTE *)CONCAT44(local_178.ip[1]._4_4_,
                            (uint)local_178.ip[1] + *(byte *)((long)DTable + sVar13 * 4 + 6));
    }
    else if ((uint)local_178.ip[1] < 0x40) {
      local_178.ip[1]._0_4_ = (uint)local_178.ip[1] + *(byte *)((long)DTable + sVar13 * 4 + 6);
      uVar29 = 0x40;
      if ((uint)local_178.ip[1] < 0x40) {
        uVar29 = (uint)local_178.ip[1];
      }
      local_178.ip[1] = (BYTE *)CONCAT44(local_178.ip[1]._4_4_,uVar29);
    }
  }
  if ((ulong)((long)local_198 - (long)puVar22) < 8) {
    if (local_258.bitsConsumed < 0x41) {
      if (local_258.ptr < local_258.limitPtr) {
        if (local_258.ptr != local_258.start) {
          uVar29 = (int)local_258.ptr - (int)local_258.start;
          if (local_258.start <=
              (ulong *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3))) {
            uVar29 = local_258.bitsConsumed >> 3;
          }
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar29);
          local_258.bitsConsumed = local_258.bitsConsumed + uVar29 * -8;
          local_258.bitContainer = *(size_t *)local_258.ptr;
        }
      }
      else {
        BIT_reloadDStreamFast(&local_258);
        puVar22 = local_1b8;
        puVar30 = local_1c0;
      }
    }
  }
  else {
    if ((uVar19 & 0xff) < 0xc) {
      puVar15 = (ushort *)((long)local_198 - 9);
      bVar18 = -(char)local_228 & 0x3f;
      while( true ) {
        BVar12 = BIT_DStream_overflow;
        if (local_258.bitsConsumed < 0x41) {
          if (local_258.ptr < local_258.limitPtr) {
            if (local_258.ptr != local_258.start) {
              bVar37 = (ulong *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3)) <
                       local_258.start;
              uVar29 = (int)local_258.ptr - (int)local_258.start;
              if (!bVar37) {
                uVar29 = local_258.bitsConsumed >> 3;
              }
              BVar12 = (BIT_DStream_status)bVar37;
              local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar29);
              local_258.bitsConsumed = local_258.bitsConsumed + uVar29 * -8;
              local_258.bitContainer = *(size_t *)local_258.ptr;
            }
          }
          else {
            BVar12 = BIT_reloadDStreamFast(&local_258);
            puVar30 = local_1c0;
          }
        }
        if ((puVar15 <= puVar22) || (BVar12 != BIT_DStream_unfinished)) goto LAB_00220376;
        if ((uVar19 & 0xff) == 0) break;
        uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> bVar18;
        *puVar22 = (ushort)DTable[uVar26 + 1];
        iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_258.bitsConsumed;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        uVar20 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
        *(short *)((long)puVar22 + uVar26) = (short)DTable[uVar20 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
        uVar34 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + uVar26;
        *(short *)((long)puVar22 + uVar20 + uVar26) = (short)DTable[uVar34 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
        uVar26 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
        *(short *)((long)puVar22 + uVar20 + lVar14) = (short)DTable[uVar26 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
        uVar34 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + lVar14;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        *(short *)((long)puVar22 + uVar26 + lVar14) = (short)DTable[uVar34 + 1];
        local_258.bitsConsumed = iVar21 + (uint)*(byte *)((long)DTable + uVar34 * 4 + 6);
        puVar22 = (ushort *)
                  ((long)puVar22 + (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7) + uVar26 + lVar14
                  );
      }
      goto LAB_00221126;
    }
    puVar15 = (ushort *)((long)local_198 - 7);
    bVar18 = -(char)local_228 & 0x3f;
    while( true ) {
      BVar12 = BIT_DStream_overflow;
      if (local_258.bitsConsumed < 0x41) {
        if (local_258.ptr < local_258.limitPtr) {
          if (local_258.ptr != local_258.start) {
            bVar37 = (ulong *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3)) <
                     local_258.start;
            uVar29 = (int)local_258.ptr - (int)local_258.start;
            if (!bVar37) {
              uVar29 = local_258.bitsConsumed >> 3;
            }
            BVar12 = (BIT_DStream_status)bVar37;
            local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar29);
            local_258.bitsConsumed = local_258.bitsConsumed + uVar29 * -8;
            local_258.bitContainer = *(size_t *)local_258.ptr;
          }
        }
        else {
          BVar12 = BIT_reloadDStreamFast(&local_258);
          puVar30 = local_1c0;
        }
      }
      if ((puVar15 <= puVar22) || (BVar12 != BIT_DStream_unfinished)) break;
      uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> bVar18;
      *puVar22 = (ushort)DTable[uVar26 + 1];
      iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_258.bitsConsumed;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar34 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
      *(short *)((long)puVar22 + uVar26) = (short)DTable[uVar34 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
      uVar20 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      *(short *)((long)puVar22 + uVar34 + uVar26) = (short)DTable[uVar20 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
      uVar35 = (local_258.bitContainer << ((byte)iVar21 & 0x3f)) >> bVar18;
      lVar14 = uVar34 + uVar26;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
      *(short *)((long)puVar22 + uVar26 + lVar14) = (short)DTable[uVar35 + 1];
      local_258.bitsConsumed = iVar21 + (uint)*(byte *)((long)DTable + uVar35 * 4 + 6);
      puVar22 = (ushort *)
                ((long)puVar22 + (ulong)*(byte *)((long)DTable + uVar35 * 4 + 7) + uVar26 + lVar14);
    }
LAB_00220376:
    cVar24 = (char)local_228;
    dstSize = local_1b0;
    puVar16 = local_1a8;
  }
  uVar29 = uVar19 & 0xff;
  if (1 < (ulong)((long)local_198 - (long)puVar22)) {
    puVar15 = local_198 + -1;
    do {
      if (local_258.bitsConsumed < 0x41) {
        if (local_258.ptr < local_258.limitPtr) {
          if (local_258.ptr == local_258.start) goto LAB_002203d9;
          bVar37 = local_258.start <=
                   (ulong *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
          uVar31 = (int)local_258.ptr - (int)local_258.start;
          if (bVar37) {
            uVar31 = local_258.bitsConsumed >> 3;
          }
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar31);
          local_258.bitsConsumed = local_258.bitsConsumed + uVar31 * -8;
          local_258.bitContainer = *(size_t *)local_258.ptr;
          puVar30 = local_1c0;
        }
        else {
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
          local_258._8_8_ = local_258._8_8_ & 0xffffffff00000007;
          local_258.bitContainer = *(size_t *)local_258.ptr;
          bVar37 = true;
        }
      }
      else {
LAB_002203d9:
        bVar37 = false;
      }
      if ((puVar15 < puVar22) || (!bVar37)) {
        if (puVar15 < puVar22) break;
        if (uVar29 != 0) goto LAB_002204ae;
        goto LAB_00221126;
      }
      if (uVar29 == 0) goto LAB_00221126;
      uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >>
               (-cVar24 & 0x3fU);
      *puVar22 = (ushort)DTable[uVar26 + 1];
      local_258.bitsConsumed = local_258.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
      puVar22 = (ushort *)((long)puVar22 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
    } while( true );
  }
LAB_002204e0:
  if (puVar22 < local_198) {
    sVar13 = BIT_lookBitsFast(&local_258,uVar29);
    *(char *)puVar22 = (char)DTable[sVar13 + 1];
    puVar30 = local_1c0;
    if (*(char *)((long)DTable + sVar13 * 4 + 7) == '\x01') {
      local_258.bitsConsumed = local_258.bitsConsumed + *(byte *)((long)DTable + sVar13 * 4 + 6);
    }
    else if (local_258.bitsConsumed < 0x40) {
      uVar29 = local_258.bitsConsumed + *(byte *)((long)DTable + sVar13 * 4 + 6);
      local_258.bitsConsumed = 0x40;
      if (uVar29 < 0x40) {
        local_258.bitsConsumed = uVar29;
      }
    }
  }
  if ((ulong)((long)puVar16 - (long)puVar30) < 8) {
    if ((uint)uStack_1e0 < 0x41) {
      if (local_1d8 < local_1c8) {
        if (local_1d8 != puStack_1d0) {
          uVar29 = (int)local_1d8 - (int)puStack_1d0;
          if (puStack_1d0 <= (ulong *)((long)local_1d8 - (ulong)((uint)uStack_1e0 >> 3))) {
            uVar29 = (uint)uStack_1e0 >> 3;
          }
          local_1d8 = (ulong *)((long)local_1d8 - (ulong)uVar29);
          uStack_1e0 = CONCAT44(uStack_1e0._4_4_,(uint)uStack_1e0 + uVar29 * -8);
          local_1e8 = (undefined1  [8])*local_1d8;
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)local_1e8);
        puVar30 = local_1c0;
      }
    }
  }
  else {
    if ((uVar19 & 0xff) < 0xc) {
      bVar18 = -(char)local_228 & 0x3f;
      while( true ) {
        BVar12 = BIT_DStream_overflow;
        if ((uint)uStack_1e0 < 0x41) {
          if (local_1d8 < local_1c8) {
            if (local_1d8 != puStack_1d0) {
              bVar37 = (ulong *)((long)local_1d8 - (ulong)((uint)uStack_1e0 >> 3)) < puStack_1d0;
              uVar29 = (int)local_1d8 - (int)puStack_1d0;
              if (!bVar37) {
                uVar29 = (uint)uStack_1e0 >> 3;
              }
              BVar12 = (BIT_DStream_status)bVar37;
              local_1d8 = (ulong *)((long)local_1d8 - (ulong)uVar29);
              uStack_1e0 = CONCAT44(uStack_1e0._4_4_,(uint)uStack_1e0 + uVar29 * -8);
              local_1e8 = (undefined1  [8])*local_1d8;
            }
          }
          else {
            BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_1e8);
          }
        }
        if (((ushort *)((long)puVar16 + -9) <= puVar30) || (BVar12 != BIT_DStream_unfinished))
        goto LAB_00220935;
        if ((uVar19 & 0xff) == 0) break;
        uVar26 = (ulong)((long)local_1e8 << ((byte)uStack_1e0 & 0x3f)) >> bVar18;
        *(ushort *)puVar30 = (ushort)DTable[uVar26 + 1];
        iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + (uint)uStack_1e0;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        uVar20 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
        *(short *)((long)puVar30 + uVar26) = (short)DTable[uVar20 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
        uVar34 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + uVar26;
        *(short *)((long)puVar30 + uVar20 + uVar26) = (short)DTable[uVar34 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
        uVar26 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
        *(short *)((long)puVar30 + uVar20 + lVar14) = (short)DTable[uVar26 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
        uVar34 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + lVar14;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        *(short *)((long)puVar30 + uVar26 + lVar14) = (short)DTable[uVar34 + 1];
        uStack_1e0 = CONCAT44(uStack_1e0._4_4_,
                              iVar21 + (uint)*(byte *)((long)DTable + uVar34 * 4 + 6));
        puVar30 = (ulong *)((long)puVar30 +
                           (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7) + uVar26 + lVar14);
      }
      goto LAB_00221126;
    }
    bVar18 = -(char)local_228 & 0x3f;
    while( true ) {
      BVar12 = BIT_DStream_overflow;
      if ((uint)uStack_1e0 < 0x41) {
        if (local_1d8 < local_1c8) {
          if (local_1d8 != puStack_1d0) {
            bVar37 = (ulong *)((long)local_1d8 - (ulong)((uint)uStack_1e0 >> 3)) < puStack_1d0;
            uVar29 = (int)local_1d8 - (int)puStack_1d0;
            if (!bVar37) {
              uVar29 = (uint)uStack_1e0 >> 3;
            }
            BVar12 = (BIT_DStream_status)bVar37;
            local_1d8 = (ulong *)((long)local_1d8 - (ulong)uVar29);
            uStack_1e0 = CONCAT44(uStack_1e0._4_4_,(uint)uStack_1e0 + uVar29 * -8);
            local_1e8 = (undefined1  [8])*local_1d8;
          }
        }
        else {
          BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_1e8);
        }
      }
      if (((ushort *)((long)puVar16 + -7) <= puVar30) || (BVar12 != BIT_DStream_unfinished)) break;
      uVar26 = (ulong)((long)local_1e8 << ((byte)uStack_1e0 & 0x3f)) >> bVar18;
      *(ushort *)puVar30 = (ushort)DTable[uVar26 + 1];
      iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + (uint)uStack_1e0;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar34 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
      *(short *)((long)puVar30 + uVar26) = (short)DTable[uVar34 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
      uVar20 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      *(short *)((long)puVar30 + uVar34 + uVar26) = (short)DTable[uVar20 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
      uVar35 = (ulong)((long)local_1e8 << ((byte)iVar21 & 0x3f)) >> bVar18;
      lVar14 = uVar34 + uVar26;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
      *(short *)((long)puVar30 + uVar26 + lVar14) = (short)DTable[uVar35 + 1];
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,iVar21 + (uint)*(byte *)((long)DTable + uVar35 * 4 + 6)
                           );
      puVar30 = (ulong *)((long)puVar30 +
                         (ulong)*(byte *)((long)DTable + uVar35 * 4 + 7) + uVar26 + lVar14);
    }
LAB_00220935:
    cVar24 = (char)local_228;
    dstSize = local_1b0;
    puVar16 = local_1a8;
  }
  uVar29 = uVar19 & 0xff;
  if (1 < (ulong)((long)puVar16 - (long)puVar30)) {
    puVar15 = puVar16 + -1;
    do {
      if ((uint)uStack_1e0 < 0x41) {
        if (local_1d8 < local_1c8) {
          if (local_1d8 == puStack_1d0) goto LAB_0022098e;
          bVar37 = puStack_1d0 <= (ulong *)((long)local_1d8 - (ulong)((uint)uStack_1e0 >> 3));
          uVar31 = (int)local_1d8 - (int)puStack_1d0;
          if (bVar37) {
            uVar31 = (uint)uStack_1e0 >> 3;
          }
          local_1d8 = (ulong *)((long)local_1d8 - (ulong)uVar31);
          uStack_1e0 = CONCAT44(uStack_1e0._4_4_,(uint)uStack_1e0 + uVar31 * -8);
          local_1e8 = (undefined1  [8])*local_1d8;
        }
        else {
          local_1d8 = (ulong *)((long)local_1d8 - (ulong)((uint)uStack_1e0 >> 3));
          uStack_1e0 = uStack_1e0 & 0xffffffff00000007;
          local_1e8 = (undefined1  [8])*local_1d8;
          bVar37 = true;
        }
      }
      else {
LAB_0022098e:
        bVar37 = false;
      }
      if ((puVar15 < puVar30) || (!bVar37)) {
        if (puVar15 < puVar30) break;
        if (uVar29 != 0) goto LAB_00220a88;
        goto LAB_00221126;
      }
      if (uVar29 == 0) goto LAB_00221126;
      uVar26 = (ulong)((long)local_1e8 << ((byte)uStack_1e0 & 0x3f)) >> (-cVar24 & 0x3fU);
      *(ushort *)puVar30 = (ushort)DTable[uVar26 + 1];
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,
                            (uint)uStack_1e0 + *(byte *)((long)DTable + uVar26 * 4 + 6));
      puVar30 = (ulong *)((long)puVar30 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
    } while( true );
  }
LAB_00220ac3:
  if (puVar30 < puVar16) {
    sVar13 = BIT_lookBitsFast((BIT_DStream_t *)local_1e8,uVar29);
    *(char *)puVar30 = (char)DTable[sVar13 + 1];
    if (*(char *)((long)DTable + sVar13 * 4 + 7) == '\x01') {
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,
                            (uint)uStack_1e0 + *(byte *)((long)DTable + sVar13 * 4 + 6));
    }
    else if ((uint)uStack_1e0 < 0x40) {
      uStack_1e0._0_4_ = (uint)uStack_1e0 + *(byte *)((long)DTable + sVar13 * 4 + 6);
      uVar29 = 0x40;
      if ((uint)uStack_1e0 < 0x40) {
        uVar29 = (uint)uStack_1e0;
      }
      uStack_1e0 = CONCAT44(uStack_1e0._4_4_,uVar29);
    }
  }
  if ((ulong)((long)local_180 - (long)local_220) < 8) {
    if ((uint)uStack_210 < 0x41) {
      if (local_208 < local_1f8) {
        if (local_208 != puStack_200) {
          uVar29 = (int)local_208 - (int)puStack_200;
          if (puStack_200 <= (ulong *)((long)local_208 - (ulong)((uint)uStack_210 >> 3))) {
            uVar29 = (uint)uStack_210 >> 3;
          }
          local_208 = (ulong *)((long)local_208 - (ulong)uVar29);
          uStack_210 = CONCAT44(uStack_210._4_4_,(uint)uStack_210 + uVar29 * -8);
          local_218 = (undefined1  [8])*local_208;
        }
      }
      else {
        BIT_reloadDStreamFast((BIT_DStream_t *)local_218);
      }
    }
  }
  else {
    if ((uVar19 & 0xff) < 0xc) {
      puVar15 = (ushort *)((long)local_180 - 9);
      bVar18 = -(char)local_228 & 0x3f;
      while( true ) {
        BVar12 = BIT_DStream_overflow;
        if ((uint)uStack_210 < 0x41) {
          if (local_208 < local_1f8) {
            if (local_208 != puStack_200) {
              bVar37 = (ulong *)((long)local_208 - (ulong)((uint)uStack_210 >> 3)) < puStack_200;
              uVar29 = (int)local_208 - (int)puStack_200;
              if (!bVar37) {
                uVar29 = (uint)uStack_210 >> 3;
              }
              BVar12 = (BIT_DStream_status)bVar37;
              local_208 = (ulong *)((long)local_208 - (ulong)uVar29);
              uStack_210 = CONCAT44(uStack_210._4_4_,(uint)uStack_210 + uVar29 * -8);
              local_218 = (undefined1  [8])*local_208;
            }
          }
          else {
            BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_218);
          }
        }
        if ((puVar15 <= local_220) || (BVar12 != BIT_DStream_unfinished)) goto LAB_00220e9f;
        if ((uVar19 & 0xff) == 0) break;
        uVar26 = (ulong)((long)local_218 << ((byte)uStack_210 & 0x3f)) >> bVar18;
        *local_220 = (ushort)DTable[uVar26 + 1];
        iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + (uint)uStack_210;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        uVar20 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
        *(short *)((long)local_220 + uVar26) = (short)DTable[uVar20 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
        uVar34 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + uVar26;
        *(short *)((long)local_220 + uVar20 + uVar26) = (short)DTable[uVar34 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
        uVar26 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
        uVar20 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
        *(short *)((long)local_220 + uVar20 + lVar14) = (short)DTable[uVar26 + 1];
        iVar21 = (uint)*(byte *)((long)DTable + uVar26 * 4 + 6) + iVar21;
        uVar34 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
        lVar14 = uVar20 + lVar14;
        uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
        *(short *)((long)local_220 + uVar26 + lVar14) = (short)DTable[uVar34 + 1];
        uStack_210 = CONCAT44(uStack_210._4_4_,
                              iVar21 + (uint)*(byte *)((long)DTable + uVar34 * 4 + 6));
        local_220 = (ushort *)
                    ((long)local_220 +
                    (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7) + uVar26 + lVar14);
      }
LAB_00221126:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    bVar18 = -(char)local_228 & 0x3f;
    while( true ) {
      BVar12 = BIT_DStream_overflow;
      if ((uint)uStack_210 < 0x41) {
        if (local_208 < local_1f8) {
          if (local_208 != puStack_200) {
            bVar37 = (ulong *)((long)local_208 - (ulong)((uint)uStack_210 >> 3)) < puStack_200;
            uVar29 = (int)local_208 - (int)puStack_200;
            if (!bVar37) {
              uVar29 = (uint)uStack_210 >> 3;
            }
            BVar12 = (BIT_DStream_status)bVar37;
            local_208 = (ulong *)((long)local_208 - (ulong)uVar29);
            uStack_210 = CONCAT44(uStack_210._4_4_,(uint)uStack_210 + uVar29 * -8);
            local_218 = (undefined1  [8])*local_208;
          }
        }
        else {
          BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)local_218);
        }
      }
      if ((local_c0 <= local_220) || (BVar12 != BIT_DStream_unfinished)) break;
      uVar26 = (ulong)((long)local_218 << ((byte)uStack_210 & 0x3f)) >> bVar18;
      *local_220 = (ushort)DTable[uVar26 + 1];
      iVar21 = *(byte *)((long)DTable + uVar26 * 4 + 6) + (uint)uStack_210;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7);
      uVar34 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
      *(short *)((long)local_220 + uVar26) = (short)DTable[uVar34 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar34 * 4 + 6) + iVar21;
      uVar20 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
      uVar34 = (ulong)*(byte *)((long)DTable + uVar34 * 4 + 7);
      *(short *)((long)local_220 + uVar34 + uVar26) = (short)DTable[uVar20 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar20 * 4 + 6) + iVar21;
      uVar35 = (ulong)((long)local_218 << ((byte)iVar21 & 0x3f)) >> bVar18;
      lVar14 = uVar34 + uVar26;
      uVar26 = (ulong)*(byte *)((long)DTable + uVar20 * 4 + 7);
      *(short *)((long)local_220 + uVar26 + lVar14) = (short)DTable[uVar35 + 1];
      uStack_210 = CONCAT44(uStack_210._4_4_,iVar21 + (uint)*(byte *)((long)DTable + uVar35 * 4 + 6)
                           );
      local_220 = (ushort *)
                  ((long)local_220 +
                  (ulong)*(byte *)((long)DTable + uVar35 * 4 + 7) + uVar26 + lVar14);
    }
LAB_00220e9f:
    cVar24 = (char)local_228;
  }
  uVar19 = uVar19 & 0xff;
  puVar15 = local_220;
  if (1 < (ulong)((long)local_180 - (long)local_220)) {
    puVar16 = local_180 + -1;
    do {
      if ((uint)uStack_210 < 0x41) {
        if (local_208 < local_1f8) {
          if (local_208 == puStack_200) goto LAB_00220ee7;
          bVar37 = puStack_200 <= (ulong *)((long)local_208 - (ulong)((uint)uStack_210 >> 3));
          uVar29 = (int)local_208 - (int)puStack_200;
          if (bVar37) {
            uVar29 = (uint)uStack_210 >> 3;
          }
          local_208 = (ulong *)((long)local_208 - (ulong)uVar29);
          uStack_210 = CONCAT44(uStack_210._4_4_,(uint)uStack_210 + uVar29 * -8);
          local_218 = (undefined1  [8])*local_208;
        }
        else {
          local_208 = (ulong *)((long)local_208 - (ulong)((uint)uStack_210 >> 3));
          uStack_210 = uStack_210 & 0xffffffff00000007;
          local_218 = (undefined1  [8])*local_208;
          bVar37 = true;
        }
      }
      else {
LAB_00220ee7:
        bVar37 = false;
      }
      if ((puVar16 < local_220) || (!bVar37)) {
        puVar15 = local_220;
        if (puVar16 < local_220) break;
        if (uVar19 != 0) goto LAB_00220fc8;
        goto LAB_00221126;
      }
      if (uVar19 == 0) goto LAB_00221126;
      uVar26 = (ulong)((long)local_218 << ((byte)uStack_210 & 0x3f)) >> (-cVar24 & 0x3fU);
      *local_220 = (ushort)DTable[uVar26 + 1];
      uStack_210 = CONCAT44(uStack_210._4_4_,
                            (uint)uStack_210 + *(byte *)((long)DTable + uVar26 * 4 + 6));
      local_220 = (ushort *)((long)local_220 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
    } while( true );
  }
LAB_00220ffa:
  if (puVar15 < local_180) {
    sVar13 = BIT_lookBitsFast((BIT_DStream_t *)local_218,uVar19);
    *(char *)puVar15 = (char)DTable[sVar13 + 1];
    if (*(char *)((long)DTable + sVar13 * 4 + 7) == '\x01') {
      uStack_210 = (ulong)((uint)uStack_210 + *(byte *)((long)DTable + sVar13 * 4 + 6));
    }
    else if ((uint)uStack_210 < 0x40) {
      uStack_210._0_4_ = (uint)uStack_210 + *(byte *)((long)DTable + sVar13 * 4 + 6);
      uVar19 = 0x40;
      if ((uint)uStack_210 < 0x40) {
        uVar19 = (uint)uStack_210;
      }
      uStack_210 = (ulong)uVar19;
    }
  }
  if ((uint)uStack_210 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_208 != puStack_200) {
    dstSize = 0xffffffffffffffec;
  }
  if ((uint)uStack_1e0 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_1d8 != puStack_1d0) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_258.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_258.ptr != local_258.start) {
    dstSize = 0xffffffffffffffec;
  }
  if ((uint)local_178.ip[1] != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_178.ip[2] != local_178.ip[3]) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
LAB_0021ea65:
  dstSize = local_1b0;
  local_190 = sVar13;
LAB_0021eaa4:
  if (1 < (ulong)((long)puVar15 - (long)puVar22)) {
    do {
      if (local_258.bitsConsumed < 0x41) {
        if (local_258.ptr < local_258.limitPtr) {
          if (local_258.ptr == local_258.start) goto LAB_0021eac5;
          bVar37 = local_258.start <=
                   (U64 *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
          uVar19 = (int)local_258.ptr - iVar21;
          if (bVar37) {
            uVar19 = local_258.bitsConsumed >> 3;
          }
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)uVar19);
          local_258.bitsConsumed = local_258.bitsConsumed + uVar19 * -8;
          local_258.bitContainer = *(U64 *)local_258.ptr;
        }
        else {
          local_258.ptr = (char *)((long)local_258.ptr - (ulong)(local_258.bitsConsumed >> 3));
          local_258._8_8_ = local_258._8_8_ & 0xffffffff00000007;
          local_258.bitContainer = *(U64 *)local_258.ptr;
          bVar37 = true;
        }
      }
      else {
LAB_0021eac5:
        bVar37 = false;
      }
      if ((puVar15 + -1 < puVar22) || (!bVar37)) goto joined_r0x0021eb7d;
      uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> 0x35;
      *puVar22 = (ushort)DTable[uVar26 + 1];
      local_258.bitsConsumed = local_258.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
      puVar22 = (ushort *)((long)puVar22 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
    } while( true );
  }
LAB_0021ebb0:
  if (puVar15 <= puVar22) goto LAB_0021ec03;
  uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> 0x35;
  *(char *)puVar22 = (char)DTable[uVar26 + 1];
  if (*(char *)((long)DTable + uVar26 * 4 + 7) == '\x01') {
    uVar19 = *(byte *)((long)DTable + uVar26 * 4 + 6) + local_258.bitsConsumed;
LAB_0021ebfc:
    local_258.bitsConsumed = uVar19;
  }
  else if (local_258.bitsConsumed < 0x40) {
    uVar19 = local_258.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
    if (0x3f < uVar19) {
      uVar19 = 0x40;
    }
    goto LAB_0021ebfc;
  }
  puVar22 = (ushort *)((long)puVar22 + 1);
LAB_0021ec03:
  puVar22 = (ushort *)((long)puVar22 + ((long)local_178.op[lVar14] - (long)puVar16));
  local_178.op[lVar14] = (BYTE *)puVar22;
  bVar37 = puVar22 == puVar15;
  if (!bVar37) {
    sVar13 = 0xffffffffffffffec;
  }
LAB_0021ec27:
  sVar17 = sVar13;
  if ((!bVar37) || (lVar14 = lVar14 + 1, sVar17 = dstSize, lVar14 == 4)) goto LAB_0021ec3e;
  goto LAB_0021e858;
joined_r0x0021eb7d:
  for (; puVar22 <= puVar15 + -1;
      puVar22 = (ushort *)((long)puVar22 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7))) {
    uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> 0x35;
    *puVar22 = (ushort)DTable[uVar26 + 1];
    local_258._12_4_ = SUB84((ulong)local_258._8_8_ >> 0x20,0);
    local_258.bitsConsumed = local_258.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
  }
  goto LAB_0021ebb0;
LAB_0021ff28:
  do {
    uVar26 = (ulong)((long)local_178.ip[0] << ((byte)local_178.ip[1] & 0x3f)) >> (-cVar24 & 0x3fU);
    *puVar23 = (ushort)DTable[uVar26 + 1];
    local_178.ip[1] =
         (BYTE *)CONCAT44(local_178.ip[1]._4_4_,
                          (uint)local_178.ip[1] + *(byte *)((long)DTable + uVar26 * 4 + 6));
    puVar23 = (ushort *)((long)puVar23 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
  } while (puVar23 <= puVar1);
  goto LAB_0021ff62;
LAB_002204ae:
  do {
    uVar26 = (local_258.bitContainer << ((byte)local_258.bitsConsumed & 0x3f)) >> (-cVar24 & 0x3fU);
    *puVar22 = (ushort)DTable[uVar26 + 1];
    local_258.bitsConsumed = local_258.bitsConsumed + *(byte *)((long)DTable + uVar26 * 4 + 6);
    puVar22 = (ushort *)((long)puVar22 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
  } while (puVar22 <= puVar15);
  goto LAB_002204e0;
LAB_00220a88:
  do {
    uVar26 = (ulong)((long)local_1e8 << ((byte)uStack_1e0 & 0x3f)) >> (-cVar24 & 0x3fU);
    *(ushort *)puVar30 = (ushort)DTable[uVar26 + 1];
    uStack_1e0 = CONCAT44(uStack_1e0._4_4_,
                          (uint)uStack_1e0 + *(byte *)((long)DTable + uVar26 * 4 + 6));
    puVar30 = (ulong *)((long)puVar30 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
  } while (puVar30 <= puVar15);
  goto LAB_00220ac3;
LAB_00220fc8:
  do {
    uVar26 = (ulong)((long)local_218 << ((byte)uStack_210 & 0x3f)) >> (-cVar24 & 0x3fU);
    *puVar15 = (ushort)DTable[uVar26 + 1];
    uStack_210 = CONCAT44(uStack_210._4_4_,
                          (uint)uStack_210 + *(byte *)((long)DTable + uVar26 * 4 + 6));
    puVar15 = (ushort *)((long)puVar15 + (ulong)*(byte *)((long)DTable + uVar26 * 4 + 7));
  } while (puVar15 <= puVar16);
  goto LAB_00220ffa;
}

Assistant:

static size_t HUF_decompress4X2_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X2_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X2_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X2_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X2_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}